

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

bool __thiscall json::Value::has(Value *this,IString x)

{
  size_type sVar1;
  undefined1 local_18 [8];
  IString x_local;
  
  x_local.str._M_len = (size_t)x.str._M_str;
  local_18 = (undefined1  [8])x.str._M_len;
  if (this->type == Object) {
    sVar1 = std::
            _Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count((_Hashtable<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(this->field_1).arr,(key_type *)local_18);
    return sVar1 != 0;
  }
  __assert_fail("isObject()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                ,0x1bb,"bool json::Value::has(IString)");
}

Assistant:

bool has(IString x) {
    assert(isObject());
    return obj->count(x) > 0;
  }